

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ArenaImpl::AddCleanupFallback
          (ArenaImpl *this,void *elem,_func_void_void_ptr *cleanup)

{
  CleanupNode *pCVar1;
  SerialArena *this_00;
  
  this_00 = GetSerialArena(this);
  pCVar1 = this_00->cleanup_ptr_;
  if (pCVar1 != this_00->cleanup_limit_) {
    pCVar1->elem = elem;
    pCVar1->cleanup = cleanup;
    this_00->cleanup_ptr_ = pCVar1 + 1;
    return;
  }
  SerialArena::AddCleanupFallback(this_00,elem,cleanup);
  return;
}

Assistant:

PROTOBUF_NOINLINE
void ArenaImpl::AddCleanupFallback(void* elem, void (*cleanup)(void*)) {
  GetSerialArena()->AddCleanup(elem, cleanup);
}